

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O3

char * TEST_cargo_malloc_zero_bytes(void)

{
  int iVar1;
  char *pcVar2;
  cargo_t cargo;
  cargo_t local_10;
  
  pcVar2 = (char *)0x0;
  iVar1 = cargo_init(&local_10,0,"program");
  if (iVar1 == 0) {
    replaced_cargo_malloc = (cargo_malloc_f)0x0;
    replaced_cargo_realloc = (cargo_realloc_f)0x0;
    replaced_cargo_free = (cargo_free_f)0x0;
    malloc_current = 0;
    malloc_fail_count = 0;
    cargo_destroy(&local_10);
  }
  else {
    pcVar2 = "Failed to init cargo";
  }
  return pcVar2;
}

Assistant:

_TEST_START(TEST_cargo_malloc_zero_bytes)
{
    cargo_set_memfunctions(_cargo_test_malloc, NULL, NULL);
    _cargo_test_set_malloc_fail_count(0);

    cargo_assert(_cargo_malloc(0) == NULL, "Did not get expected error");
    cargo_assert(malloc_current == 0, "Unexpected call to malloc");

    _TEST_CLEANUP();
    cargo_set_memfunctions(NULL, NULL, NULL);
    _cargo_test_set_malloc_fail_count(0);
}